

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  JsonParse *pJVar1;
  sqlite3_context *ctx_00;
  int in_ESI;
  u32 rc;
  int i;
  char *zPath;
  JsonParse *p;
  JsonParse *in_stack_ffffffffffffffc8;
  u32 uVar2;
  int iVar3;
  
  uVar2 = 0xaaaaaaaa;
  if ((0 < in_ESI) &&
     (pJVar1 = jsonParseFuncArg((sqlite3_context *)CONCAT44(p._4_4_,p._0_4_),(sqlite3_value *)zPath,
                                i), pJVar1 != (JsonParse *)0x0)) {
    for (iVar3 = 1; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
      ctx_00 = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x22f748);
      if (ctx_00 == (sqlite3_context *)0x0) {
LAB_0022f82d:
        jsonParseFree((JsonParse *)0x22f837);
        return;
      }
      if (*(char *)&ctx_00->pOut != '$') {
        jsonBadPathError(ctx_00,(char *)CONCAT44(iVar3,uVar2));
        goto LAB_0022f82d;
      }
      if (*(char *)((long)&ctx_00->pOut + 1) == '\0') goto LAB_0022f82d;
      pJVar1->eEdit = '\x01';
      pJVar1->delta = 0;
      uVar2 = jsonLookupStep((JsonParse *)ctx,argc,(char *)argv,p._4_4_);
      if ((0xfffffffc < uVar2) && (uVar2 != 0xfffffffe)) {
        if (uVar2 == 0xfffffffd) {
          jsonBadPathError(ctx_00,(char *)CONCAT44(iVar3,0xfffffffd));
        }
        else {
          sqlite3_result_error
                    ((sqlite3_context *)CONCAT44(iVar3,uVar2),(char *)in_stack_ffffffffffffffc8,0);
        }
        goto LAB_0022f82d;
      }
    }
    jsonReturnParse((sqlite3_context *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffc8);
    jsonParseFree((JsonParse *)0x22f81c);
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  const char *zPath = 0; /* Path of element to be removed */
  int i;                 /* Loop counter */
  u32 rc;                /* Subroutine return code */

  if( argc<1 ) return;
  p = jsonParseFuncArg(ctx, argv[0], argc>1 ? JSON_EDITABLE : 0);
  if( p==0 ) return;
  for(i=1; i<argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ){
      goto json_remove_done;
    }
    if( zPath[0]!='$' ){
      goto json_remove_patherror;
    }
    if( zPath[1]==0 ){
      /* json_remove(j,'$') returns NULL */
      goto json_remove_done;
    }
    p->eEdit = JEDIT_DEL;
    p->delta = 0;
    rc = jsonLookupStep(p, 0, zPath+1, 0);
    if( JSON_LOOKUP_ISERROR(rc) ){
      if( rc==JSON_LOOKUP_NOTFOUND ){
        continue;  /* No-op */
      }else if( rc==JSON_LOOKUP_PATHERROR ){
        jsonBadPathError(ctx, zPath);
      }else{
        sqlite3_result_error(ctx, "malformed JSON", -1);
      }
      goto json_remove_done;
    }
  }
  jsonReturnParse(ctx, p);
  jsonParseFree(p);
  return;

json_remove_patherror:
  jsonBadPathError(ctx, zPath);

json_remove_done:
  jsonParseFree(p);
  return;
}